

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_test.cpp
# Opt level: O0

void __thiscall Properties_Epsilon_Test::~Properties_Epsilon_Test(Properties_Epsilon_Test *this)

{
  Properties_Epsilon_Test *this_local;
  
  ~Properties_Epsilon_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Properties, Epsilon) {
  Manifold cube = Manifold::Cube();
  EXPECT_FLOAT_EQ(cube.GetEpsilon(), kPrecision);
  cube = cube.Scale({0.1, 1, 10});
  EXPECT_FLOAT_EQ(cube.GetEpsilon(), 10 * kPrecision);
  cube = cube.Translate({-100, -10, -1});
  EXPECT_FLOAT_EQ(cube.GetEpsilon(), 100 * kPrecision);
}